

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O3

pair<unsigned_long,_unsigned_long> __thiscall
embree::avx::
HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
sequential_spatial_split
          (HeuristicArraySpatialSAH<embree::avx::TriangleSplitterFactory,_embree::PrimRef,_32UL,_16UL>
           *this,SpatialSplit *split,PrimInfoExtRange *set,PrimInfoExtRange *lset,
          PrimInfoExtRange *rset)

{
  undefined1 auVar1 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  PrimRef *pPVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  unsigned_long uVar15;
  unsigned_long uVar16;
  PrimRef *pPVar17;
  PrimRef *pPVar18;
  unsigned_long uVar19;
  uint uVar20;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  pair<unsigned_long,_unsigned_long> pVar38;
  
  uVar4 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar5 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  auVar1._0_4_ = split->pos;
  auVar1._4_4_ = split->left;
  auVar1._8_4_ = split->right;
  auVar1._12_4_ = split->factor;
  auVar7 = vpermilps_avx(auVar1,0);
  auVar1 = *(undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)split->dim & 0x1f)) * 0x10);
  pPVar6 = this->prims0;
  pPVar18 = pPVar6 + uVar4;
  pPVar17 = pPVar6 + uVar5;
  aVar21.m128[2] = INFINITY;
  aVar21._0_8_ = 0x7f8000007f800000;
  aVar21.m128[3] = INFINITY;
  aVar22.m128[2] = -INFINITY;
  aVar22._0_8_ = 0xff800000ff800000;
  aVar22.m128[3] = -INFINITY;
  uVar16 = 0;
  uVar15 = 0;
  aVar23 = aVar22;
  aVar26 = aVar21;
  aVar27 = aVar21;
  aVar28 = aVar22;
  aVar29 = aVar21;
  aVar30 = aVar22;
  do {
    pPVar17 = pPVar17 + -1;
    if (pPVar18 <= pPVar17) {
      do {
        aVar2 = (pPVar18->lower).field_0.field_1;
        aVar3 = (pPVar18->upper).field_0.field_1;
        auVar31._0_4_ = aVar2.x + aVar3.x;
        auVar31._4_4_ = aVar2.y + aVar3.y;
        auVar31._8_4_ = aVar2.z + aVar3.z;
        auVar31._12_4_ = aVar2.field_3.w + aVar3.field_3.w;
        auVar33._0_4_ = auVar31._0_4_ * 0.5;
        auVar33._4_4_ = auVar31._4_4_ * 0.5;
        auVar33._8_4_ = auVar31._8_4_ * 0.5;
        auVar33._12_4_ = auVar31._12_4_ * 0.5;
        auVar33 = vsubps_avx(auVar33,(undefined1  [16])(split->mapping).ofs.field_0);
        auVar34._0_4_ = (split->mapping).scale.field_0.v[0] * auVar33._0_4_;
        auVar34._4_4_ = (split->mapping).scale.field_0.v[1] * auVar33._4_4_;
        auVar34._8_4_ = (split->mapping).scale.field_0.v[2] * auVar33._8_4_;
        auVar34._12_4_ = (split->mapping).scale.field_0.v[3] * auVar33._12_4_;
        auVar33 = vroundps_avx(auVar34,1);
        auVar33 = vcvtps2dq_avx(auVar33);
        auVar24._8_4_ = 0xf;
        auVar24._0_8_ = 0xf0000000f;
        auVar24._12_4_ = 0xf;
        auVar33 = vpminsd_avx(auVar33,auVar24);
        auVar33 = vpmaxsd_avx(auVar33,_DAT_01f7aa10);
        auVar33 = vpcmpgtd_avx(auVar7,auVar33);
        auVar33 = auVar1 & auVar33;
        if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar33 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar33 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar33[0xf]
           ) break;
        uVar20 = vextractps_avx((undefined1  [16])aVar2,3);
        aVar27.m128 = (__m128)vminps_avx(aVar27.m128,(undefined1  [16])aVar2);
        aVar28.m128 = (__m128)vmaxps_avx(aVar28.m128,(undefined1  [16])aVar3);
        aVar29.m128 = (__m128)vminps_avx(aVar29.m128,auVar31);
        aVar30.m128 = (__m128)vmaxps_avx(aVar30.m128,auVar31);
        uVar15 = uVar15 + (uVar20 >> 0x1b);
        pPVar18 = pPVar18 + 1;
      } while (pPVar18 <= pPVar17);
    }
    if (pPVar17 < pPVar18) {
LAB_012cd7e7:
      uVar19 = (long)pPVar18 - (long)pPVar6 >> 5;
      (lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar27;
      (lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar28;
      (lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar29;
      (lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar30;
      (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar4;
      (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar19;
      (lset->super_extended_range<unsigned_long>)._ext_end = uVar19;
      (rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar26;
      (rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar23;
      (rset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar21;
      (rset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar22;
      (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar19;
      (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar5;
      (rset->super_extended_range<unsigned_long>)._ext_end = uVar5;
      pVar38.second = uVar16;
      pVar38.first = uVar15;
      return pVar38;
    }
    while( true ) {
      aVar2 = (pPVar17->lower).field_0.field_1;
      aVar3 = (pPVar17->upper).field_0.field_1;
      auVar37._0_4_ = aVar2.x + aVar3.x;
      auVar37._4_4_ = aVar2.y + aVar3.y;
      auVar37._8_4_ = aVar2.z + aVar3.z;
      auVar37._12_4_ = aVar2.field_3.w + aVar3.field_3.w;
      auVar35._0_4_ = auVar37._0_4_ * 0.5;
      auVar35._4_4_ = auVar37._4_4_ * 0.5;
      auVar35._8_4_ = auVar37._8_4_ * 0.5;
      auVar35._12_4_ = auVar37._12_4_ * 0.5;
      auVar33 = vsubps_avx(auVar35,(undefined1  [16])(split->mapping).ofs.field_0);
      auVar36._0_4_ = (split->mapping).scale.field_0.v[0] * auVar33._0_4_;
      auVar36._4_4_ = (split->mapping).scale.field_0.v[1] * auVar33._4_4_;
      auVar36._8_4_ = (split->mapping).scale.field_0.v[2] * auVar33._8_4_;
      auVar36._12_4_ = (split->mapping).scale.field_0.v[3] * auVar33._12_4_;
      auVar33 = vroundps_avx(auVar36,1);
      auVar33 = vcvtps2dq_avx(auVar33);
      auVar25._8_4_ = 0xf;
      auVar25._0_8_ = 0xf0000000f;
      auVar25._12_4_ = 0xf;
      auVar33 = vpminsd_avx(auVar33,auVar25);
      auVar33 = vpmaxsd_avx(auVar33,_DAT_01f7aa10);
      auVar33 = vpcmpgtd_avx(auVar7,auVar33);
      uVar20 = vextractps_avx((undefined1  [16])aVar2,3);
      auVar33 = auVar1 & auVar33;
      if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar33[0xf] < '\0'
         ) break;
      aVar26.m128 = (__m128)vminps_avx(aVar26.m128,(undefined1  [16])aVar2);
      aVar23.m128 = (__m128)vmaxps_avx(aVar23.m128,(undefined1  [16])aVar3);
      aVar21.m128 = (__m128)vminps_avx(aVar21.m128,auVar37);
      aVar22.m128 = (__m128)vmaxps_avx(aVar22.m128,auVar37);
      uVar16 = uVar16 + (uVar20 >> 0x1b);
      pPVar17 = pPVar17 + -1;
      if (pPVar17 < pPVar18) goto LAB_012cd7e7;
    }
    aVar27.m128 = (__m128)vminps_avx(aVar27.m128,(undefined1  [16])aVar2);
    aVar28.m128 = (__m128)vmaxps_avx(aVar28.m128,(undefined1  [16])aVar3);
    aVar29.m128 = (__m128)vminps_avx(aVar29.m128,auVar37);
    aVar30.m128 = (__m128)vmaxps_avx(aVar30.m128,auVar37);
    uVar15 = uVar15 + (uVar20 >> 0x1b);
    aVar2 = (pPVar18->lower).field_0.field_1;
    aVar3 = (pPVar18->upper).field_0.field_1;
    aVar26.m128 = (__m128)vminps_avx(aVar26.m128,(undefined1  [16])aVar2);
    aVar23.m128 = (__m128)vmaxps_avx(aVar23.m128,(undefined1  [16])aVar3);
    auVar32._0_4_ = aVar2.x + aVar3.x;
    auVar32._4_4_ = aVar2.y + aVar3.y;
    auVar32._8_4_ = aVar2.z + aVar3.z;
    auVar32._12_4_ = aVar2.field_3.w + aVar3.field_3.w;
    aVar21.m128 = (__m128)vminps_avx(aVar21.m128,auVar32);
    aVar22.m128 = (__m128)vmaxps_avx(aVar22.m128,auVar32);
    uVar16 = uVar16 + ((uint)(pPVar18->lower).field_0.m128[3] >> 0x1b);
    uVar8 = *(undefined8 *)&(pPVar18->lower).field_0;
    uVar9 = *(undefined8 *)((long)&(pPVar18->lower).field_0 + 8);
    uVar10 = *(undefined8 *)&(pPVar18->upper).field_0;
    uVar11 = *(undefined8 *)((long)&(pPVar18->upper).field_0 + 8);
    uVar12 = *(undefined8 *)((long)&(pPVar17->lower).field_0 + 8);
    uVar13 = *(undefined8 *)&(pPVar17->upper).field_0;
    uVar14 = *(undefined8 *)((long)&(pPVar17->upper).field_0 + 8);
    *(undefined8 *)&(pPVar18->lower).field_0 = *(undefined8 *)&(pPVar17->lower).field_0;
    *(undefined8 *)((long)&(pPVar18->lower).field_0 + 8) = uVar12;
    *(undefined8 *)&(pPVar18->upper).field_0 = uVar13;
    *(undefined8 *)((long)&(pPVar18->upper).field_0 + 8) = uVar14;
    *(undefined8 *)&(pPVar17->lower).field_0 = uVar8;
    *(undefined8 *)((long)&(pPVar17->lower).field_0 + 8) = uVar9;
    *(undefined8 *)&(pPVar17->upper).field_0 = uVar10;
    *(undefined8 *)((long)&(pPVar17->upper).field_0 + 8) = uVar11;
    pPVar18 = pPVar18 + 1;
  } while( true );
}

Assistant:

__noinline std::pair<size_t,size_t> sequential_spatial_split(const SpatialSplit& split, const PrimInfoExtRange& set, PrimInfoExtRange& lset, PrimInfoExtRange& rset) 
        {
          const size_t begin = set.begin();
          const size_t end   = set.end();
          PrimInfo local_left(empty);
          PrimInfo local_right(empty);
          const unsigned int splitPos = split.pos;
          const unsigned int splitDim = split.dim;
          const unsigned int splitDimMask = (unsigned int)1 << splitDim; 

          /* init spatial mapping */
          const SpatialBinMapping<SPATIAL_BINS> &mapping = split.mapping;
          const vint4 vSplitPos(splitPos);
          const vbool4 vSplitMask( (int)splitDimMask );

          size_t center = serial_partitioning(prims0,
                                              begin,end,local_left,local_right,
                                              [&] (const PrimRef& ref) {
                                                const Vec3fa c = ref.bounds().center();
                                                return any(((vint4)mapping.bin(c) < vSplitPos) & vSplitMask);
                                              },
                                              [] (PrimInfo& pinfo,const PrimRef& ref) { pinfo.add_center2(ref,ref.lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)); });

          const size_t left_weight  = local_left.end;
          const size_t right_weight = local_right.end;
          
          new (&lset) PrimInfoExtRange(begin,center,center,local_left);
          new (&rset) PrimInfoExtRange(center,end,end,local_right);
          assert(!lset.geomBounds.empty() && area(lset.geomBounds) >= 0.0f);
          assert(!rset.geomBounds.empty() && area(rset.geomBounds) >= 0.0f);
          return std::pair<size_t,size_t>(left_weight,right_weight);
        }